

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O1

StElemInfo * __thiscall
Memory::AllocateArray<Memory::Recycler,Js::StElemInfo,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  StElemInfo *pSVar1;
  StElemInfo *this_00;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pSVar1 = (StElemInfo *)&DAT_00000008;
  }
  else {
    pSVar1 = (StElemInfo *)
             new__<Memory::Recycler>
                       (-(ulong)(count >> 0x3e != 0) | count * 4,(Recycler *)this,
                        (offset_in_Recycler_to_subr)allocator);
    this_00 = pSVar1;
    do {
      ValueType::ValueType(&this_00->arrayType);
      this_00->flags = FldInfo_NoInfo;
      this_00->field_2 = (anon_union_1_2_471f577c_for_StElemInfo_2)0x1;
      this_00 = this_00 + 1;
    } while (this_00 != pSVar1 + count);
  }
  return pSVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}